

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O2

bool __thiscall ftxui::anon_unknown_3::CheckboxBase::OnEvent(CheckboxBase *this,Event *event)

{
  long __rhs;
  CheckboxOption *pCVar1;
  bool bVar2;
  __type _Var3;
  CheckboxOption *pCVar4;
  undefined1 local_a0 [64];
  Event local_60;
  
  if (event->type_ != Mouse) {
    Event::Character(&local_60,' ');
    __rhs = (long)&local_60 + 0x18;
    _Var3 = std::operator==(&event->input_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __rhs);
    if (_Var3) {
      std::__cxx11::string::~string((string *)__rhs);
    }
    else {
      _Var3 = std::operator==(&event->input_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (Event::Return + 0x18));
      std::__cxx11::string::~string((string *)__rhs);
      if (!_Var3) {
        return false;
      }
    }
    *this->state_ = (bool)(*this->state_ ^ 1);
    pCVar1 = (this->option_).address_;
    pCVar4 = &(this->option_).owned_;
    if (pCVar1 != (CheckboxOption *)0x0) {
      pCVar4 = pCVar1;
    }
    std::function<void_()>::operator()(&pCVar4->on_change);
    return true;
  }
  Event::Event((Event *)local_a0,event);
  ComponentBase::CaptureMouse((ComponentBase *)&local_60,(Event *)this);
  if ((_func_int **)local_60._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_60._0_8_ + 8))();
    bVar2 = Box::Contain(&this->box_,local_a0._16_4_,local_a0._20_4_);
    if (bVar2) {
      ComponentBase::TakeFocus(&this->super_ComponentBase);
      bVar2 = false;
      if ((local_a0._4_4_ == Left) && (bVar2 = false, local_a0._8_4_ == Pressed)) {
        *this->state_ = (bool)(*this->state_ ^ 1);
        pCVar1 = (this->option_).address_;
        pCVar4 = &(this->option_).owned_;
        if (pCVar1 != (CheckboxOption *)0x0) {
          pCVar4 = pCVar1;
        }
        bVar2 = true;
        std::function<void_()>::operator()(&pCVar4->on_change);
      }
      goto LAB_0012f8a2;
    }
  }
  bVar2 = false;
LAB_0012f8a2:
  std::__cxx11::string::~string((string *)(local_a0 + 0x18));
  return bVar2;
}

Assistant:

bool OnEvent(Event event) override {
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (event == Event::Character(' ') || event == Event::Return) {
      *state_ = !*state_;
      option_->on_change();
      return true;
    }
    return false;
  }